

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenMatrixBaseSerialize.hpp
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
serialize<boost::archive::text_iarchive>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this,text_iarchive *ar,
          uint version)

{
  undefined1 *this_00;
  int j;
  int iVar1;
  int i;
  long lVar2;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *t;
  int c;
  int r;
  
  c = 1;
  this_00 = &ar->field_0x28;
  r = c;
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,&r)
  ;
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,&c)
  ;
  for (iVar1 = 0; iVar1 < c; iVar1 = iVar1 + 1) {
    t = this;
    for (lVar2 = 0; lVar2 < r; lVar2 = lVar2 + 1) {
      boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
      load<double>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
                   this_00,(double *)t);
      t = t + 1;
    }
  }
  return;
}

Assistant:

inline void serialize(Archive & ar, const unsigned int version)
{
    int r = this->rows();     // makes sense for saving only
    int c = this->cols();

    ar & boost::serialization::make_nvp("rows",r);
    ar & boost::serialization::make_nvp("cols",c);

    this->resize(r,c);        // makes sense for loading only

    for(int j = 0; j < c; j++)
	    for(int i = 0; i < r; i++)
            ar & boost::serialization::make_nvp("data",this->operator()(i,j));
}